

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::RgbaOutputFile::RgbaOutputFile
          (RgbaOutputFile *this,OStream *os,Header *header,RgbaChannels rgbaChannels,int numThreads)

{
  OutputFile *this_00;
  ToYca *this_01;
  Header hd;
  Header local_60;
  
  this->_vptr_RgbaOutputFile = (_func_int **)&PTR__RgbaOutputFile_0043c060;
  this->_outputFile = (OutputFile *)0x0;
  this->_toYca = (ToYca *)0x0;
  Header::Header(&local_60,header);
  anon_unknown_1::insertChannels(&local_60,rgbaChannels);
  this_00 = (OutputFile *)operator_new(0x10);
  OutputFile::OutputFile(this_00,os,&local_60,numThreads);
  this->_outputFile = this_00;
  if ((rgbaChannels & WRITE_YC) != 0) {
    this_01 = (ToYca *)operator_new(0x160);
    ToYca::ToYca(this_01,this_00,rgbaChannels);
    this->_toYca = this_01;
  }
  Header::~Header(&local_60);
  return;
}

Assistant:

RgbaOutputFile::RgbaOutputFile (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os,
				const Header &header,
				RgbaChannels rgbaChannels,
                                int numThreads):
    _outputFile (0),
    _toYca (0)
{
    Header hd (header);
    insertChannels (hd, rgbaChannels);
    _outputFile = new OutputFile (os, hd, numThreads);

    if (rgbaChannels & (WRITE_Y | WRITE_C))
	_toYca = new ToYca (*_outputFile, rgbaChannels);
}